

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileListOperation<long>::
     Finalize<duckdb::list_entry_t,duckdb::ReservoirQuantileState<long>>
               (ReservoirQuantileState<long> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  long *__first;
  FunctionData *pFVar2;
  long lVar3;
  uint64_t uVar4;
  reference pvVar5;
  ulong uVar6;
  size_t q;
  ulong __n;
  uint64_t uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  
  if (state->pos != 0) {
    pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    lVar3 = duckdb::ListVector::GetEntry(finalize_data->result);
    uVar4 = duckdb::ListVector::GetListSize(finalize_data->result);
    duckdb::ListVector::Reserve
              (finalize_data->result,(*(long *)(pFVar2 + 0x10) - *(long *)(pFVar2 + 8) >> 3) + uVar4
              );
    __first = state->v;
    lVar3 = *(long *)(lVar3 + 0x20);
    target->offset = uVar4;
    uVar7 = *(long *)(pFVar2 + 0x10) - *(long *)(pFVar2 + 8) >> 3;
    target->length = uVar7;
    for (__n = 0; __n < uVar7; __n = __n + 1) {
      pvVar5 = vector<double,_true>::get<true>((vector<double,_true> *)(pFVar2 + 8),__n);
      lVar1 = state->pos - 1;
      auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar8._0_8_ = lVar1;
      auVar8._12_4_ = 0x45300000;
      dVar9 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * *pvVar5;
      uVar6 = (ulong)dVar9;
      std::nth_element<long*>
                (__first,__first + ((long)(dVar9 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f |
                                   uVar6),__first + state->pos);
      *(long *)(uVar4 * 8 + lVar3 + __n * 8) =
           __first[(long)(dVar9 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6];
      uVar7 = target->length;
    }
    duckdb::ListVector::SetListSize(finalize_data->result,uVar7 + target->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v;
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			auto offset = (idx_t)((double)(state.pos - 1) * quantile);
			std::nth_element(v_t, v_t + offset, v_t + state.pos);
			rdata[ridx + q] = v_t[offset];
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}